

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::setTag(FederateState *this,string_view tag,string_view value)

{
  __atomic_flag_data_type _Var1;
  pointer ppVar2;
  int iVar3;
  pointer ppVar4;
  char *__s1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type __rlen;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  __s1 = tag._M_str;
  __n = tag._M_len;
  local_48._M_str = value._M_str;
  local_48._M_len = value._M_len;
  do {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  ppVar4 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_len = __n;
  local_38._M_str = __s1;
  if (ppVar4 != ppVar2) {
    this_00 = &ppVar4->second;
    do {
      if (__n == this_00[-1]._M_string_length) {
        if (__n == 0) {
LAB_00319b17:
          LOCK();
          (this->processing).super___atomic_flag_base._M_i = false;
          UNLOCK();
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00,0,this_00->_M_string_length,local_48._M_str,local_48._M_len);
          return;
        }
        iVar3 = bcmp(__s1,this_00[-1]._M_dataplus._M_p,__n);
        if (iVar3 == 0) goto LAB_00319b17;
      }
      ppVar4 = (pointer)(this_00 + 1);
      this_00 = this_00 + 2;
    } while (ppVar4 != ppVar2);
  }
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&this->tags,&local_38,&local_48);
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void FederateState::setTag(std::string_view tag, std::string_view value)
{
    spinlock();
    for (auto& testTag : tags) {
        if (testTag.first == tag) {
            unlock();
            testTag.second = value;
            return;
        }
    }
    tags.emplace_back(tag, value);
    unlock();
}